

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

int unpackIfAllDigits(char *input)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  byte bVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  char *s;
  char *pcVar8;
  bool bVar9;
  
  bVar9 = (*input & 0xdfU) == 0x41;
  pcVar3 = input + bVar9;
  bVar4 = input[bVar9];
  if (bVar4 == 0) {
    bVar9 = true;
  }
  else {
    pcVar8 = (char *)0x0;
    do {
      if (((pcVar3[2] == '\0') || (pcVar3[2] == '-')) || (bVar4 == 0x2d)) break;
      pcVar1 = pcVar3;
      if ((pcVar8 != (char *)0x0 || bVar4 != 0x2e) &&
         (pcVar1 = pcVar8, 9 < (byte)decodeChar_decode_chars[bVar4])) {
        return 0;
      }
      pcVar8 = pcVar1;
      bVar4 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (bVar4 != 0);
    bVar9 = pcVar8 == (char *)0x0;
  }
  if (bVar9) {
    return 0;
  }
  if ((byte)(*input | 0x20U) == 0x61) {
    iVar2 = 0x3e0;
    if ((bVar4 | 0x20) != 0x61) {
      iVar2 = (int)(char)decodeChar_decode_chars[bVar4] << 5;
    }
    iVar5 = 0x1f;
    if ((byte)(pcVar3[1] | 0x20U) != 0x61) {
      iVar5 = (int)(char)decodeChar_decode_chars[(byte)pcVar3[1]];
    }
    iVar5 = iVar5 + iVar2;
    *input = ((char)(uint)((ulong)((long)iVar5 * 0x51eb851f) >> 0x25) - (char)(iVar5 >> 0x1f)) + '0'
    ;
    iVar2 = iVar5 / 10;
    *pcVar3 = (char)iVar2 +
              ((char)(uint)((ulong)((long)iVar2 * 0x66666667) >> 0x22) - (char)(iVar2 >> 0x1f)) *
              -10 + '0';
    pcVar3[1] = (char)iVar5 + (char)iVar2 * -10 + '0';
  }
  else {
    bVar6 = (bVar4 + 0xbf) * '@' | (byte)(bVar4 + 0xbf) >> 2;
    if (0xd < bVar6) {
      return 0;
    }
    if ((0x2323U >> (bVar6 & 0x1f) & 1) == 0) {
      return 0;
    }
    bVar4 = (bVar4 + 0xbb) * '\x10' | (byte)(bVar4 + 0xbb) >> 4;
    iVar2 = 0;
    if (bVar4 < 4) {
      iVar2 = (&DAT_001c3360)[bVar4];
    }
    bVar4 = pcVar3[1] + 0xbf;
    bVar4 = bVar4 * '@' | bVar4 >> 2;
    if ((bVar4 < 0xe) && ((0x2323U >> (bVar4 & 0x1f) & 1) != 0)) {
      iVar5 = *(int *)(&DAT_002172f8 + (ulong)bVar4 * 4);
    }
    else {
      iVar5 = (int)(char)decodeChar_decode_chars[(byte)pcVar3[1]];
      if ((char)decodeChar_decode_chars[(byte)pcVar3[1]] < '\0') {
        return -0x129;
      }
    }
    uVar7 = iVar2 + iVar5;
    if (99 < (int)uVar7) {
      return -0x127;
    }
    *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(ulong)uVar7 / 10];
    pcVar3[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar7 % 10];
  }
  return 1;
}

Assistant:

static int unpackIfAllDigits(char *input) {
    char *s = input;
    char *dotpos = NULL;
    const int aonly = ((*s == 'A') || (*s == 'a'));
    if (aonly) {
        s++;
    } // v1.50
    for (; *s != 0 && s[2] != 0 && s[2] != '-'; s++) {
        if (*s == '-') {
            break;
        } else if (*s == '.' && !dotpos) {
            dotpos = s;
        } else if ((decodeChar(*s) < 0) || (decodeChar(*s) > 9)) {
            return 0;
        }  // nondigit, so stop
    }

    if (dotpos) {
        if (aonly) // v1.50 encoded only with A's
        {
            const int v = (((s[0] == 'A') || (s[0] == 'a')) ? 31 : decodeChar(s[0])) * 32 +
                          (((s[1] == 'A') || (s[1] == 'a')) ? 31 : decodeChar(s[1]));
            *input = (char) ('0' + (v / 100));
            s[0] = (char) ('0' + ((v / 10) % 10));
            s[1] = (char) ('0' + (v % 10));
            return 1;
        } // v1.50

        if ((*s == 'a') || (*s == 'e') || (*s == 'u') ||
            (*s == 'A') || (*s == 'E') || (*s == 'U')) {
            char *e = s + 1;  // s is vowel, e is lastchar

            int v = 0;
            if (*s == 'e' || *s == 'E') {
                v = 34;
            } else if (*s == 'u' || *s == 'U') {
                v = 68;
            }

            if ((*e == 'a') || (*e == 'A')) {
                v += 31;
            } else if ((*e == 'e') || (*e == 'E')) {
                v += 32;
            } else if ((*e == 'u') || (*e == 'U')) {
                v += 33;
            } else if (decodeChar(*e) < 0) {
                return (int) ERR_INVALID_CHARACTER;
            } else {
                v += decodeChar(*e);
            }

            if (v < 100) {
                *s = ENCODE_CHARS[(unsigned int) v / 10];
                *e = ENCODE_CHARS[(unsigned int) v % 10];
            } else {
                return (int) ERR_INVALID_ENDVOWELS; // mapcodes ends in UE or UU
            }
            return 1;
        }
    }
    return 0; // no vowel just before end
}